

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_manager.cpp
# Opt level: O2

string * __thiscall
duckdb::ErrorManager::FormatExceptionRecursive_abi_cxx11_
          (string *__return_storage_ptr__,ErrorManager *this,ErrorType error_type,
          vector<duckdb::ExceptionFormatValue,_true> *values)

{
  pointer pEVar1;
  bool bVar2;
  iterator iVar3;
  InternalException *this_00;
  vector<duckdb::ExceptionFormatValue,_true> *__range1;
  pointer pEVar4;
  ErrorType error_type_local;
  allocator local_51;
  string error;
  
  error_type_local = error_type;
  if (INVALIDATED_DATABASE < error_type) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&error,"Invalid error type passed to ErrorManager::FormatError",&local_51);
    InternalException::InternalException(this_00,(string *)&error);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar3 = ::std::
          _Rb_tree<duckdb::ErrorType,_std::pair<const_duckdb::ErrorType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_duckdb::ErrorType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<duckdb::ErrorType>,_std::allocator<std::pair<const_duckdb::ErrorType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<duckdb::ErrorType,_std::pair<const_duckdb::ErrorType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_duckdb::ErrorType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<duckdb::ErrorType>,_std::allocator<std::pair<const_duckdb::ErrorType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,&error_type_local);
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  if ((_Rb_tree_header *)iVar3._M_node == &(this->custom_errors)._M_t._M_impl.super__Rb_tree_header)
  {
    ::std::__cxx11::string::assign((char *)&error);
    if (error_type_local == INVALIDATED_DATABASE) {
      pEVar4 = (values->
               super_vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
               ).
               super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pEVar1 = (values->
               super_vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
               ).
               super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (pEVar4 == pEVar1) {
          ::std::__cxx11::string::append((char *)&error);
          goto LAB_019ceea9;
        }
        bVar2 = StringUtil::Contains((string *)&pEVar4->str_val,(string *)&error);
        pEVar4 = pEVar4 + 1;
      } while (!bVar2);
      ::std::__cxx11::string::assign((char *)&error);
      ExceptionFormatValue::Format
                ((string *)__return_storage_ptr__,(string *)&error,
                 (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                  *)values);
      goto LAB_019ceeb9;
    }
  }
  else {
    ::std::__cxx11::string::_M_assign((string *)&error);
  }
LAB_019ceea9:
  ExceptionFormatValue::Format
            ((string *)__return_storage_ptr__,(string *)&error,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             values);
LAB_019ceeb9:
  ::std::__cxx11::string::~string((string *)&error);
  return __return_storage_ptr__;
}

Assistant:

string ErrorManager::FormatExceptionRecursive(ErrorType error_type, vector<ExceptionFormatValue> &values) {
	if (error_type >= ErrorType::ERROR_COUNT) {
		throw InternalException("Invalid error type passed to ErrorManager::FormatError");
	}
	auto entry = custom_errors.find(error_type);
	string error;
	if (entry != custom_errors.end()) {
		// Error was overwritten.
		error = entry->second;
		return ExceptionFormatValue::Format(error, values);
	}

	// Error was not overwritten.
	error = internal_errors[int(error_type)].error;

	if (error_type != ErrorType::INVALIDATED_DATABASE) {
		return ExceptionFormatValue::Format(error, values);
	}

	for (const auto &val : values) {
		if (StringUtil::Contains(val.str_val, error)) {
			error = "%s";
			return ExceptionFormatValue::Format(error, values);
		}
	}
	error += "Original error: \"%s\"";
	return ExceptionFormatValue::Format(error, values);
}